

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint _w;
  uint uVar9;
  Mat *this_00;
  size_type sVar10;
  size_t sVar11;
  uint uVar12;
  float fVar13;
  int *piVar14;
  Interp *pIVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  long lVar21;
  void *pvVar22;
  size_t sVar23;
  void *pvVar24;
  void *pvVar25;
  int iVar26;
  void *pvVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  void *pvVar36;
  void *pvVar37;
  long lVar38;
  float *rows1_old;
  long lVar39;
  undefined4 *puVar40;
  void *pvVar41;
  int iVar42;
  float *rows2_old;
  ulong uVar43;
  void *pvVar44;
  int dx;
  long lVar45;
  float *pfVar46;
  Mat *pMVar47;
  int iVar48;
  void *pvVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  void *local_1e8;
  int outh;
  size_t local_1c8;
  Mat *local_1c0;
  int outw;
  Interp *local_1b0;
  float *local_1a8;
  ulong local_1a0;
  void *local_198;
  void *local_190;
  size_t local_188;
  ulong local_180;
  float *local_178;
  int *local_170;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar47 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = pMVar47->w;
  uVar8 = pMVar47->h;
  uVar32 = (ulong)uVar8;
  local_1a0 = (ulong)(uint)pMVar47->c;
  iVar18 = pMVar47->dims;
  sVar23 = pMVar47->elemsize;
  outw = pMVar47[1].w;
  outh = pMVar47[1].h;
  if (((this->size_expr)._M_string_length != 0) &&
     (iVar17 = eval_size_expr(this,bottom_blobs,&outw,&outh), iVar17 != 0)) {
    return -1;
  }
  iVar42 = outw;
  iVar17 = outh;
  local_1c0 = pMVar47;
  local_1b0 = this;
  if (iVar18 == 2) {
    if (outw == uVar7) {
      if (this_00 == pMVar47) {
        return 0;
      }
      piVar20 = pMVar47->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      piVar20 = this_00->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_00->cstep = 0;
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      *(undefined8 *)((long)&this_00->refcount + 4) = 0;
      *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
      this_00->c = 0;
      this_00->dims = 0;
      this_00->w = 0;
      this_00->h = 0;
      this_00->d = 0;
      piVar20 = pMVar47->refcount;
      this_00->data = pMVar47->data;
      this_00->refcount = piVar20;
      this_00->elemsize = pMVar47->elemsize;
      this_00->elempack = pMVar47->elempack;
      this_00->allocator = pMVar47->allocator;
      iVar18 = pMVar47->w;
      iVar17 = pMVar47->h;
      iVar42 = pMVar47->d;
      this_00->dims = pMVar47->dims;
      this_00->w = iVar18;
      this_00->h = iVar17;
      this_00->d = iVar42;
      this_00->c = pMVar47->c;
      sVar23 = pMVar47->cstep;
      goto LAB_003d171d;
    }
    Mat::create(this_00,outw,uVar8,sVar23,opt->blob_allocator);
    pvVar49 = this_00->data;
    if (pvVar49 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    pfVar46 = (float *)(long)iVar42;
    iVar18 = local_1b0->resize_type;
    if (iVar18 == 2) {
      uVar43 = 0;
      uVar35 = (long)pfVar46 * 0xc;
      if (iVar42 < 0) {
        uVar35 = 0xffffffffffffffff;
      }
      uVar29 = 0;
      if (0 < iVar42) {
        uVar29 = (ulong)(uint)iVar42;
      }
      piVar20 = (int *)operator_new__(uVar35);
      local_1a8 = pfVar46;
      linear_coeffs(uVar7,iVar42,piVar20,(float *)(piVar20 + (long)pfVar46),local_1b0->align_corner)
      ;
      uVar35 = 0;
      if (0 < (int)uVar8) {
        uVar35 = uVar32;
      }
      for (; uVar43 != uVar35; uVar43 = uVar43 + 1) {
        iVar18 = local_1c0->w;
        sVar23 = local_1c0->elemsize;
        pvVar27 = local_1c0->data;
        iVar17 = this_00->w;
        sVar11 = this_00->elemsize;
        for (uVar31 = 0; uVar29 != uVar31; uVar31 = uVar31 + 1) {
          uVar6 = *(undefined8 *)(piVar20 + (long)pfVar46 + uVar31 * 2);
          uVar5 = *(undefined8 *)
                   ((long)pvVar27 + (long)piVar20[uVar31] * 4 + (long)iVar18 * uVar43 * sVar23);
          *(float *)((long)pvVar49 + uVar31 * 4 + sVar11 * uVar43 * (long)iVar17) =
               (float)((ulong)uVar5 >> 0x20) * (float)((ulong)uVar6 >> 0x20) +
               (float)uVar5 * (float)uVar6;
        }
      }
      operator_delete__(piVar20);
      iVar18 = local_1b0->resize_type;
      pfVar46 = local_1a8;
    }
    else if (iVar18 == 1) {
      if ((local_1b0->output_width == 0) && ((local_1b0->size_expr)._M_string_length == 0)) {
        fVar50 = 1.0 / local_1b0->width_scale;
      }
      else {
        fVar50 = (float)(int)uVar7 / (float)iVar42;
      }
      if (iVar42 < 1) {
        iVar42 = 0;
      }
      if ((int)uVar8 < 1) {
        uVar32 = 0;
      }
      for (uVar35 = 0; uVar35 != uVar32; uVar35 = uVar35 + 1) {
        iVar18 = local_1c0->w;
        sVar23 = local_1c0->elemsize;
        pvVar27 = local_1c0->data;
        iVar17 = this_00->w;
        sVar11 = this_00->elemsize;
        for (lVar30 = 0; iVar42 != (int)lVar30; lVar30 = lVar30 + 1) {
          iVar34 = (int)((float)(int)lVar30 * fVar50);
          iVar19 = uVar7 - 1;
          if (iVar34 <= (int)(uVar7 - 1)) {
            iVar19 = iVar34;
          }
          *(undefined4 *)((long)pvVar49 + lVar30 * 4 + sVar11 * uVar35 * (long)iVar17) =
               *(undefined4 *)((long)pvVar27 + (long)iVar19 * 4 + (long)iVar18 * uVar35 * sVar23);
        }
      }
      return 0;
    }
    pIVar15 = local_1b0;
    if (iVar18 != 3) {
      return 0;
    }
    uVar43 = 0;
    uVar35 = (long)pfVar46 * 0x14;
    if (iVar42 < 0) {
      uVar35 = 0xffffffffffffffff;
    }
    uVar29 = 0;
    if (0 < iVar42) {
      uVar29 = (ulong)(uint)iVar42;
    }
    piVar20 = (int *)operator_new__(uVar35);
    cubic_coeffs(uVar7,iVar42,piVar20,(float *)(piVar20 + (long)pfVar46),pIVar15->align_corner);
    if ((int)uVar8 < 1) {
      uVar32 = uVar43;
    }
    for (; uVar43 != uVar32; uVar43 = uVar43 + 1) {
      pvVar49 = local_1c0->data;
      iVar18 = local_1c0->w;
      sVar23 = local_1c0->elemsize;
      iVar17 = this_00->w;
      sVar11 = this_00->elemsize;
      pvVar27 = this_00->data;
      for (lVar30 = 0; uVar29 * 4 != lVar30; lVar30 = lVar30 + 4) {
        pfVar3 = (float *)(piVar20 + (long)pfVar46 + lVar30);
        pfVar1 = (float *)((long)pvVar49 +
                          (long)*(int *)((long)piVar20 + lVar30) * 4 +
                          (long)iVar18 * uVar43 * sVar23 + -4);
        *(float *)((long)pvVar27 + lVar30 + sVar11 * uVar43 * (long)iVar17) =
             pfVar1[3] * pfVar3[3] + pfVar1[1] * pfVar3[1] +
             pfVar1[2] * pfVar3[2] + *pfVar1 * *pfVar3;
      }
    }
  }
  else {
    if (iVar18 == 1) {
      Mat::create(this_00,outw,outh,uVar7,sVar23,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      sVar23 = this_00->cstep;
      if ((long)this_00->c * sVar23 != 0) {
        uVar32 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar32 = 0;
        }
        lVar30 = 0;
        for (uVar35 = 0; uVar35 != uVar32; uVar35 = uVar35 + 1) {
          lVar39 = (long)this_00->h * (long)this_00->w;
          uVar43 = this_00->elemsize;
          iVar18 = (int)((uVar43 * lVar39 + 0xf & 0xfffffffffffffff0) / uVar43);
          if (this_00->dims == 4) {
            iVar18 = (int)lVar39;
          }
          iVar18 = iVar18 * this_00->d;
          uVar4 = *(undefined4 *)((long)local_1c0->data + uVar35 * 4);
          if (iVar18 < 1) {
            iVar18 = 0;
          }
          pvVar49 = this_00->data;
          for (lVar39 = 0; iVar18 != (int)lVar39; lVar39 = lVar39 + 1) {
            *(undefined4 *)((long)pvVar49 + lVar39 * 4 + uVar43 * lVar30) = uVar4;
          }
          lVar30 = lVar30 + sVar23;
        }
        return 0;
      }
      return -100;
    }
    if (outh == uVar8 && outw == uVar7) {
      if (this_00 == pMVar47) {
        return 0;
      }
      piVar20 = pMVar47->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      piVar20 = this_00->refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_00->cstep = 0;
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      *(undefined8 *)((long)&this_00->refcount + 4) = 0;
      *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
      this_00->c = 0;
      this_00->dims = 0;
      this_00->w = 0;
      this_00->h = 0;
      this_00->d = 0;
      piVar20 = pMVar47->refcount;
      this_00->data = pMVar47->data;
      this_00->refcount = piVar20;
      this_00->elemsize = pMVar47->elemsize;
      this_00->elempack = pMVar47->elempack;
      this_00->allocator = pMVar47->allocator;
      iVar18 = pMVar47->w;
      iVar17 = pMVar47->h;
      iVar42 = pMVar47->d;
      this_00->dims = pMVar47->dims;
      this_00->w = iVar18;
      this_00->h = iVar17;
      this_00->d = iVar42;
      this_00->c = pMVar47->c;
      sVar23 = pMVar47->cstep;
LAB_003d171d:
      this_00->cstep = sVar23;
      return 0;
    }
    Mat::create(this_00,outw,outh,(int)local_1a0,sVar23,opt->blob_allocator);
    iVar18 = outh;
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    iVar19 = local_1b0->resize_type;
    if (iVar19 == 1) {
      sVar10 = (local_1b0->size_expr)._M_string_length;
      if (local_1b0->output_height == 0 && sVar10 == 0) {
        fVar50 = 1.0 / local_1b0->height_scale;
      }
      else {
        fVar50 = (float)(int)uVar8 / (float)iVar17;
      }
      if (local_1b0->output_width == 0 && sVar10 == 0) {
        fVar52 = 1.0 / local_1b0->width_scale;
      }
      else {
        fVar52 = (float)(int)uVar7 / (float)iVar42;
      }
      uVar32 = 0;
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      uVar35 = 0;
      if (0 < (int)local_1a0) {
        uVar35 = local_1a0 & 0xffffffff;
      }
      for (; uVar32 != uVar35; uVar32 = uVar32 + 1) {
        sVar23 = local_1c0->cstep;
        sVar11 = local_1c0->elemsize;
        pvVar49 = local_1c0->data;
        puVar40 = (undefined4 *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
        iVar42 = 0;
        iVar34 = 0;
        if (0 < outw) {
          iVar42 = 0;
          iVar34 = outw;
        }
        for (; iVar42 != iVar17; iVar42 = iVar42 + 1) {
          iVar26 = (int)((float)iVar42 * fVar50);
          if ((int)(uVar8 - 1) < (int)((float)iVar42 * fVar50)) {
            iVar26 = uVar8 - 1;
          }
          for (iVar48 = 0; iVar34 != iVar48; iVar48 = iVar48 + 1) {
            iVar28 = uVar7 - 1;
            if ((int)((float)iVar48 * fVar52) <= (int)(uVar7 - 1)) {
              iVar28 = (int)((float)iVar48 * fVar52);
            }
            *puVar40 = *(undefined4 *)
                        ((long)pvVar49 +
                        (long)(int)(iVar28 + iVar26 * uVar7) * 4 + sVar23 * uVar32 * sVar11);
            puVar40 = puVar40 + 1;
          }
        }
        iVar42 = outw;
      }
    }
    if (iVar19 == 2) {
      lVar30 = (long)outh;
      iVar17 = outh * 3 + iVar42 * 3;
      uVar32 = (long)iVar17 * 4;
      if (iVar17 < 0) {
        uVar32 = 0xffffffffffffffff;
      }
      piVar20 = (int *)operator_new__(uVar32);
      pfVar46 = (float *)(piVar20 + iVar42);
      pfVar1 = pfVar46 + lVar30;
      iVar17 = local_1b0->align_corner;
      linear_coeffs(uVar7,iVar42,piVar20,pfVar1,iVar17);
      local_1a8 = pfVar46;
      local_178 = pfVar1 + iVar42 * 2;
      linear_coeffs(uVar8,iVar18,(int *)pfVar46,pfVar1 + iVar42 * 2,iVar17);
      local_180 = 0;
      if (0 < (int)local_1a0) {
        local_180 = local_1a0 & 0xffffffff;
      }
      uVar32 = 0;
      pMVar47 = local_1c0;
      while (uVar32 != local_180) {
        local_198 = (void *)(long)pMVar47->w;
        local_188 = pMVar47->elemsize;
        local_190 = (void *)(pMVar47->cstep * uVar32 * local_188 + (long)pMVar47->data);
        _w = this_00->w;
        uVar9 = this_00->h;
        pvVar49 = this_00->data;
        local_170 = (int *)this_00->elemsize;
        local_1c8 = this_00->cstep;
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168._20_8_ = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        Mat::create(&local_168,_w,4,(Allocator *)0x0);
        local_118.cstep = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = 0;
        local_118._20_8_ = 0;
        local_118.h = 0;
        local_118.d = 0;
        local_118.c = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 0;
        local_118.w = 0;
        Mat::create(&local_118,_w,4,(Allocator *)0x0);
        pMVar47 = local_1c0;
        lVar39 = local_188 * (long)local_198;
        uVar12 = _w;
        if ((int)_w < 1) {
          uVar12 = 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        pvVar49 = (void *)((long)pvVar49 + local_1c8 * (long)local_170 * uVar32);
        local_188 = (long)(int)_w * (long)local_170;
        pvVar27 = local_168.data;
        pfVar46 = local_178;
        pvVar24 = local_118.data;
        fVar50 = -NAN;
        for (uVar35 = 0; uVar35 != uVar9; uVar35 = uVar35 + 1) {
          fVar52 = local_1a8[uVar35];
          pvVar25 = pvVar27;
          pvVar41 = pvVar24;
          if (fVar52 != fVar50) {
            lVar38 = (long)(int)fVar52;
            if (fVar52 == (float)((int)fVar50 + 1)) {
              for (uVar43 = 0; pvVar25 = pvVar24, pvVar41 = pvVar27, uVar12 != uVar43;
                  uVar43 = uVar43 + 1) {
                uVar6 = *(undefined8 *)
                         ((long)local_190 + (long)piVar20[uVar43] * 4 + (lVar38 + 1) * lVar39);
                *(float *)((long)pvVar27 + uVar43 * 4) =
                     (float)((ulong)uVar6 >> 0x20) *
                     (float)((ulong)*(undefined8 *)(piVar20 + (long)iVar42 + lVar30 + uVar43 * 2) >>
                            0x20) +
                     (float)uVar6 *
                     (float)*(undefined8 *)(piVar20 + (long)iVar42 + lVar30 + uVar43 * 2);
              }
            }
            else {
              for (uVar43 = 0; uVar12 != uVar43; uVar43 = uVar43 + 1) {
                iVar18 = piVar20[uVar43];
                fVar50 = (float)*(undefined8 *)(piVar20 + (long)iVar42 + lVar30 + uVar43 * 2);
                fVar51 = (float)((ulong)*(undefined8 *)
                                         (piVar20 + (long)iVar42 + lVar30 + uVar43 * 2) >> 0x20);
                uVar6 = *(undefined8 *)((long)local_190 + (long)iVar18 * 4 + lVar39 * lVar38);
                *(float *)((long)pvVar27 + uVar43 * 4) =
                     (float)((ulong)uVar6 >> 0x20) * fVar51 + (float)uVar6 * fVar50;
                uVar6 = *(undefined8 *)((long)local_190 + (long)iVar18 * 4 + (lVar38 + 1) * lVar39);
                *(float *)((long)pvVar24 + uVar43 * 4) =
                     (float)((ulong)uVar6 >> 0x20) * fVar51 + (float)uVar6 * fVar50;
              }
            }
          }
          pvVar24 = pvVar41;
          uVar6 = *(undefined8 *)pfVar46;
          for (lVar38 = 0; uVar12 != (uint)lVar38; lVar38 = lVar38 + 1) {
            *(float *)((long)pvVar49 + lVar38 * 4) =
                 *(float *)((long)pvVar24 + lVar38 * 4) * (float)((ulong)uVar6 >> 0x20) +
                 *(float *)((long)pvVar25 + lVar38 * 4) * (float)uVar6;
          }
          pfVar46 = pfVar46 + 2;
          pvVar49 = (void *)((long)pvVar49 + local_188);
          pvVar27 = pvVar25;
          fVar50 = fVar52;
        }
        piVar14 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        local_1c8 = uVar32;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              free(local_118.data);
            }
            else {
              (*(local_118.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar14 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        uVar32 = local_1c8 + 1;
      }
      operator_delete__(piVar20);
      iVar19 = local_1b0->resize_type;
    }
    iVar17 = outw;
    iVar18 = outh;
    if (iVar19 != 3) {
      return 0;
    }
    lVar30 = (long)outw;
    lVar39 = (long)outh;
    iVar42 = outw * 5 + outh * 5;
    uVar32 = (long)iVar42 * 4;
    if (iVar42 < 0) {
      uVar32 = 0xffffffffffffffff;
    }
    piVar20 = (int *)operator_new__(uVar32);
    pIVar15 = local_1b0;
    piVar14 = piVar20 + lVar30;
    pfVar46 = (float *)(piVar14 + lVar39);
    cubic_coeffs(uVar7,iVar17,piVar20,pfVar46,local_1b0->align_corner);
    local_178 = pfVar46 + lVar30 * 4;
    local_170 = piVar14;
    cubic_coeffs(uVar8,iVar18,piVar14,pfVar46 + lVar30 * 4,pIVar15->align_corner);
    iVar18 = (int)local_1a0;
    local_1a0 = local_1a0 & 0xffffffff;
    if (iVar18 < 1) {
      local_1a0 = 0;
    }
    uVar32 = 0;
    while (uVar32 != local_1a0) {
      local_190 = (void *)(long)local_1c0->w;
      local_1c8 = local_1c0->elemsize;
      lVar38 = local_1c0->cstep * uVar32 * local_1c8;
      pvVar49 = local_1c0->data;
      uVar7 = this_00->w;
      local_198 = (void *)(ulong)(uint)this_00->h;
      pvVar27 = this_00->data;
      local_1a8 = (float *)this_00->elemsize;
      sVar23 = this_00->cstep;
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168._20_8_ = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_180 = uVar32;
      Mat::create(&local_168,uVar7,4,(Allocator *)0x0);
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118._20_8_ = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      Mat::create(&local_118,uVar7,4,(Allocator *)0x0);
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      Mat::create(&local_c8,uVar7,4,(Allocator *)0x0);
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78._20_8_ = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      Mat::create(&local_78,uVar7,4,(Allocator *)0x0);
      local_1e8 = local_78.data;
      local_1c8 = local_1c8 * (long)local_190;
      uVar8 = uVar7;
      if ((int)uVar7 < 1) {
        uVar8 = 0;
      }
      iVar18 = (int)local_198;
      local_198 = (void *)((ulong)local_198 & 0xffffffff);
      if (iVar18 < 1) {
        local_198 = (void *)0x0;
      }
      lVar38 = lVar38 + -4;
      lVar2 = (ulong)uVar8 * 4;
      pvVar27 = (void *)((long)pvVar27 + sVar23 * (long)local_1a8 * local_180);
      local_188 = (long)(int)uVar7 * (long)local_1a8;
      local_1a8 = local_178;
      pvVar24 = local_168.data;
      pvVar25 = (void *)0x0;
      pvVar41 = local_118.data;
      pvVar44 = local_c8.data;
      iVar18 = -3;
      while (pvVar36 = pvVar25, pvVar36 != local_198) {
        iVar17 = local_170[(long)pvVar36];
        pvVar22 = local_1e8;
        pvVar25 = pvVar24;
        pvVar37 = pvVar44;
        pvVar16 = pvVar41;
        if (iVar17 != iVar18) {
          lVar33 = (long)iVar17;
          if (iVar17 == iVar18 + 1) {
            for (lVar21 = 0; pvVar22 = pvVar24, pvVar25 = pvVar41, pvVar37 = local_1e8,
                pvVar16 = pvVar44, lVar2 - lVar21 != 0; lVar21 = lVar21 + 4) {
              pfVar1 = (float *)(piVar20 + lVar30 + lVar39 + lVar21);
              pfVar46 = (float *)((long)pvVar49 +
                                 (long)*(int *)((long)piVar20 + lVar21) * 4 +
                                 (lVar33 + 2) * local_1c8 + lVar38);
              *(float *)((long)pvVar24 + lVar21) =
                   pfVar46[3] * pfVar1[3] + pfVar46[1] * pfVar1[1] +
                   pfVar46[2] * pfVar1[2] + *pfVar46 * *pfVar1;
            }
          }
          else if (iVar17 == iVar18 + 2) {
            for (lVar21 = 0; pvVar22 = pvVar41, pvVar25 = pvVar44, pvVar37 = pvVar24,
                pvVar16 = local_1e8, lVar2 - lVar21 != 0; lVar21 = lVar21 + 4) {
              iVar18 = *(int *)((long)piVar20 + lVar21);
              pfVar46 = (float *)(piVar20 + lVar30 + lVar39 + lVar21);
              fVar50 = *pfVar46;
              fVar52 = pfVar46[1];
              fVar51 = pfVar46[2];
              fVar13 = pfVar46[3];
              pfVar46 = (float *)((long)pvVar49 +
                                 (long)iVar18 * 4 + (lVar33 + 1) * local_1c8 + lVar38);
              *(float *)((long)pvVar24 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
              pfVar46 = (float *)((long)pvVar49 +
                                 (long)iVar18 * 4 + (lVar33 + 2) * local_1c8 + lVar38);
              *(float *)((long)pvVar41 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
            }
          }
          else if (iVar17 == iVar18 + 3) {
            for (lVar21 = 0; pvVar22 = pvVar44, pvVar25 = local_1e8, pvVar37 = pvVar41,
                pvVar16 = pvVar24, lVar2 - lVar21 != 0; lVar21 = lVar21 + 4) {
              lVar45 = (long)*(int *)((long)piVar20 + lVar21);
              pfVar46 = (float *)(piVar20 + lVar30 + lVar39 + lVar21);
              fVar50 = *pfVar46;
              fVar52 = pfVar46[1];
              fVar51 = pfVar46[2];
              fVar13 = pfVar46[3];
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + local_1c8 * lVar33 + lVar38);
              *(float *)((long)pvVar24 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + (lVar33 + 1) * local_1c8 + lVar38);
              *(float *)((long)pvVar41 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + (lVar33 + 2) * local_1c8 + lVar38);
              *(float *)((long)pvVar44 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
            }
          }
          else {
            for (lVar21 = 0; lVar2 - lVar21 != 0; lVar21 = lVar21 + 4) {
              lVar45 = (long)*(int *)((long)piVar20 + lVar21);
              pfVar46 = (float *)(piVar20 + lVar30 + lVar39 + lVar21);
              fVar50 = *pfVar46;
              fVar52 = pfVar46[1];
              fVar51 = pfVar46[2];
              fVar13 = pfVar46[3];
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + (lVar33 + -1) * local_1c8 + lVar38);
              *(float *)((long)pvVar24 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + local_1c8 * lVar33 + lVar38);
              *(float *)((long)pvVar41 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + (lVar33 + 1) * local_1c8 + lVar38);
              *(float *)((long)pvVar44 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
              pfVar46 = (float *)((long)pvVar49 + lVar45 * 4 + (lVar33 + 2) * local_1c8 + lVar38);
              *(float *)((long)local_1e8 + lVar21) =
                   pfVar46[3] * fVar13 + pfVar46[1] * fVar52 +
                   pfVar46[2] * fVar51 + *pfVar46 * fVar50;
            }
          }
        }
        pvVar41 = pvVar16;
        fVar50 = *local_1a8;
        fVar52 = local_1a8[1];
        fVar51 = local_1a8[2];
        fVar13 = local_1a8[3];
        for (lVar33 = 0; uVar8 != (uint)lVar33; lVar33 = lVar33 + 1) {
          *(float *)((long)pvVar27 + lVar33 * 4) =
               *(float *)((long)pvVar22 + lVar33 * 4) * fVar13 +
               *(float *)((long)pvVar41 + lVar33 * 4) * fVar52 +
               *(float *)((long)pvVar37 + lVar33 * 4) * fVar51 +
               *(float *)((long)pvVar25 + lVar33 * 4) * fVar50;
        }
        local_1a8 = local_1a8 + 4;
        pvVar27 = (void *)((long)pvVar27 + local_188);
        pvVar24 = pvVar25;
        pvVar44 = pvVar37;
        local_1e8 = pvVar22;
        local_190 = pvVar36;
        iVar18 = iVar17;
        pvVar25 = (void *)((long)pvVar36 + 1);
      }
      piVar14 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            free(local_118.data);
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar32 = local_180 + 1;
    }
  }
  operator_delete__(piVar20);
  return 0;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (!size_expr.empty())
    {
        int r = eval_size_expr(bottom_blobs, outw, outh);
        if (r != 0)
            return -1;
    }

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = (output_height || !size_expr.empty()) ? h / (float)outh : 1.f / height_scale;
        const float ws = (output_width || !size_expr.empty()) ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}